

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::integrateOutStatesAndScaleByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *integrationTmp,int *stateFrequenciesIndices
          ,int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int k_2;
  int k_1;
  float *scalingFactors;
  float sumOverI;
  int k;
  int u;
  float freq3;
  float freq2;
  float freq1;
  float freq0;
  int scalingFactorsIndex;
  int stateFrequenciesIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_30;
  
  for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
    iVar5 = *(int *)(in_R8 + (long)local_30 * 4);
    local_70 = *(int *)(*(long *)(in_RDI + 0x88) + (long)iVar5 * 4);
    iVar5 = *(int *)(*(long *)(in_RDI + 0x88) + (long)(iVar5 + 1) * 4);
    iVar6 = *(int *)(in_RDX + (long)local_30 * 4);
    iVar7 = *(int *)(in_RCX + (long)local_30 * 4);
    uVar1 = **(uint **)(*(long *)(in_RDI + 0xa0) + (long)iVar6 * 8);
    fVar2 = *(float *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar6 * 8) + 4);
    uVar3 = *(uint *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar6 * 8) + 8);
    uVar4 = *(uint *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar6 * 8) + 0xc);
    local_58 = local_70 << 2;
    for (local_5c = local_70; local_5c < iVar5; local_5c = local_5c + 1) {
      auVar10 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + (long)local_58 * 4)),ZEXT416(uVar1),
                                ZEXT416((uint)(fVar2 * *(float *)(in_RSI + (long)(local_58 + 1) * 4)
                                              )));
      auVar10 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + (long)(local_58 + 2) * 4)),ZEXT416(uVar3)
                                ,auVar10);
      auVar10 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + (long)(local_58 + 3) * 4)),ZEXT416(uVar4)
                                ,auVar10);
      local_58 = local_58 + 4;
      dVar9 = log((double)auVar10._0_4_);
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_5c * 4) = (float)dVar9;
    }
    if (iVar7 != -1) {
      lVar8 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar7 * 8);
      for (local_6c = local_70; local_6c < iVar5; local_6c = local_6c + 1) {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_6c * 4) =
             *(float *)(lVar8 + (long)local_6c * 4) +
             *(float *)(*(long *)(in_RDI + 0x108) + (long)local_6c * 4);
      }
    }
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    *(undefined8 *)(_k_2 + (long)local_30 * 8) = 0;
    for (; local_70 < iVar5; local_70 = local_70 + 1) {
      auVar12._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_70 * 4);
      auVar12._8_8_ = auVar11._8_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_70 * 8);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(_k_2 + (long)local_30 * 8);
      auVar10 = vfmadd213sd_fma(auVar10,auVar12,auVar13);
      auVar11 = ZEXT1664(auVar10);
      *(long *)(_k_2 + (long)local_30 * 8) = auVar10._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void inline BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::integrateOutStatesAndScaleByPartition(
                                                              const REALTYPE* integrationTmp,
                                                              const int* stateFrequenciesIndices,
                                                              const int* cumulativeScaleIndices,
                                                              const int* partitionIndices,
                                                              int partitionCount,
                                                              double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
      int pIndex = partitionIndices[p];
      int startPattern = gPatternPartitionsStartPatterns[pIndex];
      int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

      const int stateFrequenciesIndex = stateFrequenciesIndices[p];
      const int scalingFactorsIndex = cumulativeScaleIndices[p];

      REALTYPE freq0, freq1, freq2, freq3;
      freq0 = gStateFrequencies[stateFrequenciesIndex][0];
      freq1 = gStateFrequencies[stateFrequenciesIndex][1];
      freq2 = gStateFrequencies[stateFrequenciesIndex][2];
      freq3 = gStateFrequencies[stateFrequenciesIndex][3];

      int u = startPattern * 4;
      for(int k = startPattern; k < endPattern; k++) {
          REALTYPE sumOverI =
          freq0 * integrationTmp[u    ] +
          freq1 * integrationTmp[u + 1] +
          freq2 * integrationTmp[u + 2] +
          freq3 * integrationTmp[u + 3];

          u += 4;

          outLogLikelihoodsTmp[k] = log(sumOverI);
      }

      if (scalingFactorsIndex != BEAGLE_OP_NONE) {
          const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
          for(int k=startPattern; k < endPattern; k++) {
              outLogLikelihoodsTmp[k] += scalingFactors[k];
          }
      }

      outSumLogLikelihoodByPartition[p] = 0.0;
      for(int k=startPattern; k < endPattern; k++) {
          outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[k] * gPatternWeights[k];
      }
    }

}